

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorBuilder::~DescriptorBuilder(DescriptorBuilder *this)

{
  DescriptorBuilder *this_local;
  
  std::__cxx11::string::~string((string *)&this->undefine_resolved_name_);
  std::__cxx11::string::~string((string *)&this->possible_undeclared_dependency_name_);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set(&this->unused_dependency_);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set(&this->dependencies_);
  std::__cxx11::string::~string((string *)&this->filename_);
  std::
  vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::~vector(&this->options_to_interpret_);
  return;
}

Assistant:

DescriptorBuilder::~DescriptorBuilder() {}